

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_gc(lua_State *L,int what,int data)

{
  int iVar1;
  ulong uVar2;
  lua_State *L_00;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  MSize a;
  int res;
  global_State *g;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_1c;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  local_1c = 0;
  L_00 = (lua_State *)(ulong)in_ESI;
  switch(L_00) {
  case (lua_State *)0x0:
    *(undefined4 *)(uVar2 + 0x24) = 0x7fffff00;
    break;
  case (lua_State *)0x1:
    if (in_EDX == -1) {
      iVar1 = (*(uint *)(uVar2 + 0x20) / 100) * *(int *)(uVar2 + 0x54);
    }
    else {
      iVar1 = *(int *)(uVar2 + 0x20);
    }
    *(int *)(uVar2 + 0x24) = iVar1;
    break;
  case (lua_State *)0x2:
    lj_gc_fullgc((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    break;
  case (lua_State *)0x3:
    local_1c = *(uint *)(uVar2 + 0x20) >> 10;
    break;
  case (lua_State *)0x4:
    local_1c = *(uint *)(uVar2 + 0x20) & 0x3ff;
    break;
  case (lua_State *)0x5:
    if (*(uint *)(uVar2 + 0x20) < (uint)(in_EDX * 0x400)) {
      iVar1 = 0;
    }
    else {
      iVar1 = *(int *)(uVar2 + 0x20) + in_EDX * -0x400;
    }
    *(int *)(uVar2 + 0x24) = iVar1;
    do {
      if (*(uint *)(uVar2 + 0x20) < *(uint *)(uVar2 + 0x24)) {
        return 0;
      }
      iVar1 = lj_gc_step(L_00);
    } while (iVar1 < 1);
    local_1c = 1;
    break;
  case (lua_State *)0x6:
    local_1c = *(uint *)(uVar2 + 0x54);
    *(int *)(uVar2 + 0x54) = in_EDX;
    break;
  case (lua_State *)0x7:
    local_1c = *(uint *)(uVar2 + 0x48);
    *(int *)(uVar2 + 0x48) = in_EDX;
    break;
  default:
    local_1c = 0xffffffff;
  }
  return local_1c;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data)
{
  global_State *g = G(L);
  int res = 0;
  switch (what) {
  case LUA_GCSTOP:
    g->gc.threshold = LJ_MAX_MEM;
    break;
  case LUA_GCRESTART:
    g->gc.threshold = data == -1 ? (g->gc.total/100)*g->gc.pause : g->gc.total;
    break;
  case LUA_GCCOLLECT:
    lj_gc_fullgc(L);
    break;
  case LUA_GCCOUNT:
    res = (int)(g->gc.total >> 10);
    break;
  case LUA_GCCOUNTB:
    res = (int)(g->gc.total & 0x3ff);
    break;
  case LUA_GCSTEP: {
    MSize a = (MSize)data << 10;
    g->gc.threshold = (a <= g->gc.total) ? (g->gc.total - a) : 0;
    while (g->gc.total >= g->gc.threshold)
      if (lj_gc_step(L) > 0) {
	res = 1;
	break;
      }
    break;
  }
  case LUA_GCSETPAUSE:
    res = (int)(g->gc.pause);
    g->gc.pause = (MSize)data;
    break;
  case LUA_GCSETSTEPMUL:
    res = (int)(g->gc.stepmul);
    g->gc.stepmul = (MSize)data;
    break;
  default:
    res = -1;  /* Invalid option. */
  }
  return res;
}